

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

bool __thiscall dg::LLVMPointsToSet::isUnknownSingleton(LLVMPointsToSet *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = isSingleton((LLVMPointsToSet *)0x167527);
  local_9 = false;
  if (bVar1) {
    local_9 = hasUnknown((LLVMPointsToSet *)0x16753f);
  }
  return local_9;
}

Assistant:

bool isUnknownSingleton() const { return isSingleton() && hasUnknown(); }